

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_LhsCleared_Test::TestBody
          (GeneratedMessageReflectionSwapTest_LhsCleared_Test *this)

{
  Reflection *this_00;
  Message *in_RCX;
  TestAllTypes lhs;
  TestAllTypes rhs;
  TestAllTypes TStack_688;
  TestAllTypes local_348;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&TStack_688);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_348);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(&TStack_688);
  proto2_unittest::TestAllTypes::Clear(&TStack_688);
  this_00 = proto2_unittest::TestAllTypes::GetReflection();
  GeneratedMessageReflectionSwapTest::Swap
            ((GeneratedMessageReflectionSwapTest *)this_00,(Reflection *)&TStack_688,
             &local_348.super_Message,in_RCX);
  TestUtil::ExpectClear<proto2_unittest::TestAllTypes>(&local_348);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_348);
  proto2_unittest::TestAllTypes::~TestAllTypes(&TStack_688);
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, LhsCleared) {
  unittest::TestAllTypes lhs;
  unittest::TestAllTypes rhs;

  TestUtil::SetAllFields(&lhs);

  // For proto2 message, for message field, Clear only reset hasbits, but
  // doesn't delete the underlying field.
  lhs.Clear();

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectClear(rhs);
}